

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

void __thiscall
Inferences::InductionClauseIterator::performIntInduction
          (InductionClauseIterator *this,InductionContext *context,Entry *e,bool increasing,
          Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound>
          bound1,TermLiteralClause *optionalBound2)

{
  void *pvVar1;
  undefined *this_00;
  Signature *pSVar2;
  FixedSizeAllocator<48UL> *this_01;
  InductionContext *context_00;
  InferenceRule rule;
  uint fn;
  int iVar3;
  TermList TVar4;
  Formula *pFVar5;
  Formula *pFVar6;
  OperatorType *pOVar7;
  FixedSizeAllocator<64UL> *pFVar8;
  Literal *pLVar9;
  undefined8 extraout_RAX;
  undefined4 *puVar10;
  undefined4 *puVar11;
  undefined8 *puVar12;
  void **ppvVar13;
  undefined8 *puVar14;
  ulong uVar15;
  undefined7 in_register_00000009;
  void **head_2;
  TermList arg2;
  void **head;
  void **head_3;
  void **head_1;
  bool bVar16;
  initializer_list<Kernel::TermList> __l;
  initializer_list<Kernel::TermList> __l_00;
  initializer_list<Kernel::TermList> __l_01;
  initializer_list<Kernel::TermList> __l_02;
  ClauseStack cls;
  Substitution subst;
  allocator_type local_f1;
  Formula *local_f0;
  Formula *local_e8;
  undefined8 local_e0;
  undefined4 local_d4;
  FixedSizeAllocator<48UL> *local_d0;
  ClauseStack local_c8;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_a8;
  FixedSizeAllocator<64UL> *local_80;
  Literal *local_78;
  TermList local_70;
  Formula *local_68;
  InductionContext *local_60;
  Formula *local_58;
  Formula *local_50;
  Entry *local_48;
  InductionClauseIterator *local_40;
  Formula *local_38;
  
  this_00 = Kernel::theory;
  local_e0 = CONCAT71(in_register_00000009,increasing);
  local_f0 = (Formula *)bound1._inner._content._0_8_;
  arg2._content = (uint64_t)optionalBound2;
  local_48 = e;
  local_40 = this;
  Kernel::IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)&local_a8,(int)local_e0 - 1U | 1);
  TVar4._content =
       (uint64_t)
       Kernel::Theory::representConstant((Theory *)this_00,(IntegerConstantType *)&local_a8);
  mpz_clear((__mpz_struct *)&local_a8);
  local_c8._capacity = (size_t)local_f0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_c8;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_a8,__l,
             (allocator_type *)&local_70);
  pFVar5 = InductionContext::getFormula
                     (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                              &local_a8,true,(Substitution *)0x0);
  pvVar1 = (void *)CONCAT44(local_a8._size,local_a8._timestamp);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,CONCAT44(local_a8._nextExpansionOccupancy,local_a8._capacity) -
                           (long)pvVar1);
  }
  local_c8._capacity = 1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_c8;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_a8,__l_00,
             (allocator_type *)&local_70);
  pFVar6 = InductionContext::getFormula
                     (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                              &local_a8,true,(Substitution *)0x0);
  pvVar1 = (void *)CONCAT44(local_a8._size,local_a8._timestamp);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,CONCAT44(local_a8._nextExpansionOccupancy,local_a8._capacity) -
                           (long)pvVar1);
  }
  local_a8._timestamp = 1;
  local_a8._size = 0;
  local_a8._deleted = 0;
  local_a8._capacityIndex = 0;
  local_a8._capacity = 0;
  local_a8._nextExpansionOccupancy = 0;
  local_a8._entries._0_4_ = 0;
  local_a8._28_8_ = 0;
  local_a8._afterLast._4_4_ = 0;
  local_70._content = 5;
  __l_01._M_len = 1;
  __l_01._M_array = &local_70;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_c8,__l_01,
             &local_f1);
  local_58 = InductionContext::getFormula
                       (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                                &local_c8,true,(Substitution *)&local_a8);
  local_50 = pFVar5;
  local_38 = pFVar6;
  if ((void *)local_c8._capacity != (void *)0x0) {
    operator_delete((void *)local_c8._capacity,(long)local_c8._cursor - local_c8._capacity);
  }
  pSVar2 = DAT_00b7e1b0;
  pOVar7 = Kernel::Theory::getNonpolymorphicOperatorType(INT_PLUS);
  fn = Kernel::Signature::getInterpretingSymbol(pSVar2,INT_PLUS,pOVar7);
  local_70._content = (uint64_t)Kernel::Term::create2(fn,(TermList)0x1,TVar4);
  __l_02._M_len = 1;
  __l_02._M_array = &local_70;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_c8,__l_02,
             &local_f1);
  pFVar5 = InductionContext::getFormula
                     (context,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                              &local_c8,true,(Substitution *)0x0);
  if ((void *)local_c8._capacity != (void *)0x0) {
    operator_delete((void *)local_c8._capacity,(long)local_c8._cursor - local_c8._capacity);
  }
  local_60 = context;
  if ((performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
       ::less == '\0') &&
     (iVar3 = __cxa_guard_acquire(&performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
                                   ::less), pSVar2 = DAT_00b7e1b0, iVar3 != 0)) {
    pOVar7 = Kernel::Theory::getNonpolymorphicOperatorType(INT_LESS);
    performIntInduction::less = Kernel::Signature::getInterpretingSymbol(pSVar2,INT_LESS,pOVar7);
    __cxa_guard_release(&performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
                         ::less);
  }
  pFVar8 = (FixedSizeAllocator<64UL> *)
           ::Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  TVar4._content = 1;
  pFVar6 = local_f0;
  if ((InferenceRule)local_e0 != '\0') {
    pFVar6 = (Formula *)0x1;
    TVar4._content = (uint64_t)local_f0;
  }
  local_68 = pFVar5;
  pLVar9 = Kernel::Literal::create2
                     ((Literal *)(ulong)performIntInduction::less,0,SUB81(pFVar6,0),TVar4,arg2);
  *(undefined4 *)&(pFVar8->current).bytes = 0;
  (pFVar8->current).remaining = (size_t)(pFVar8 + 1);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pFVar8->current).remaining,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  pFVar8[1].free_list = (void **)pLVar9;
  bVar16 = true;
  if (((undefined1  [36])bound1._inner & (undefined1  [36])0x1) == (undefined1  [36])0x0) {
    if (*(uint *)(bound1._inner._content._16_8_ + 8) == performIntInduction::less) {
      bVar16 = (*(byte *)(bound1._inner._content._16_8_ + 0x28) & 4) == 0;
    }
    else {
      bVar16 = false;
    }
  }
  local_78 = (Literal *)
             ::Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  TVar4._content = 5;
  pFVar5 = local_f0;
  if (bVar16 == (bool)(InferenceRule)local_e0) {
    TVar4._content = (uint64_t)local_f0;
    pFVar5 = (Formula *)0x5;
  }
  pLVar9 = Kernel::Literal::create2
                     ((Literal *)(ulong)performIntInduction::less,(uint)(bVar16 ^ 1),SUB81(pFVar5,0)
                      ,TVar4,arg2);
  *(undefined4 *)&(local_78->super_Term)._vptr_Term = 0;
  *(int **)&(local_78->super_Term)._functor = &(local_78->super_Term)._maxRedLen;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(local_78->super_Term)._functor,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  (local_78->super_Term)._args[0]._content = (uint64_t)pLVar9;
  if (optionalBound2 == (TermLiteralClause *)0x0) {
    local_d4 = 0;
  }
  else {
    local_d4 = (undefined4)
               CONCAT71((int7)((ulong)extraout_RAX >> 8),optionalBound2->literal != (Literal *)0x0);
  }
  local_d0 = (FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60);
  if ((char)local_d4 != '\0') {
    local_e8 = (Formula *)(optionalBound2->term).super_TermList._content;
    local_80 = pFVar8;
    if (local_f0 != local_e8) {
      puVar10 = (undefined4 *)
                ::Lib::FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                          );
      TVar4._content = 1;
      pFVar5 = local_e8;
      if ((InferenceRule)local_e0 != '\0') {
        pFVar5 = (Formula *)0x1;
        TVar4._content = (uint64_t)local_e8;
      }
      pLVar9 = Kernel::Literal::create2
                         ((Literal *)(ulong)performIntInduction::less,1,SUB81(pFVar5,0),TVar4,arg2);
      *puVar10 = 0;
      *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(Literal **)(puVar10 + 10) = pLVar9;
      if ((optionalBound2->literal->super_Term)._functor == performIntInduction::less) {
        bVar16 = ((optionalBound2->literal->super_Term)._args[0]._content & 4) == 0;
      }
      else {
        bVar16 = false;
      }
      puVar11 = (undefined4 *)
                ::Lib::FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                          );
      TVar4._content = 5;
      pFVar5 = local_e8;
      if (bVar16 != (bool)(InferenceRule)local_e0) {
        pFVar5 = (Formula *)0x5;
        TVar4._content = (uint64_t)local_e8;
      }
      pLVar9 = Kernel::Literal::create2
                         ((Literal *)(ulong)performIntInduction::less,(uint)(bVar16 ^ 1),
                          SUB81(pFVar5,0),TVar4,arg2);
      *puVar11 = 0;
      *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar11 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(Literal **)(puVar11 + 10) = pLVar9;
      pFVar8 = (FixedSizeAllocator<64UL> *)::Lib::FixedSizeAllocator<48UL>::alloc(local_d0);
      puVar12 = (undefined8 *)
                ::Lib::FixedSizeAllocator<16UL>::alloc
                          ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                          );
      *puVar12 = puVar10;
      puVar12[1] = 0;
      ppvVar13 = (void **)::Lib::FixedSizeAllocator<16UL>::alloc
                                    ((FixedSizeAllocator<16UL> *)
                                     (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      *ppvVar13 = local_80;
      ppvVar13[1] = puVar12;
      *(undefined4 *)&(pFVar8->current).bytes = 1;
      (pFVar8->current).remaining = (size_t)(pFVar8 + 1);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(pFVar8->current).remaining,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      pFVar8[1].free_list = ppvVar13;
      pLVar9 = (Literal *)::Lib::FixedSizeAllocator<48UL>::alloc(local_d0);
      puVar12 = (undefined8 *)
                ::Lib::FixedSizeAllocator<16UL>::alloc
                          ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                          );
      *puVar12 = puVar11;
      puVar12[1] = 0;
      puVar14 = (undefined8 *)
                ::Lib::FixedSizeAllocator<16UL>::alloc
                          ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                          );
      *puVar14 = local_78;
      puVar14[1] = puVar12;
      *(undefined4 *)&(pLVar9->super_Term)._vptr_Term = 1;
      *(int **)&(pLVar9->super_Term)._functor = &(pLVar9->super_Term)._maxRedLen;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(pLVar9->super_Term)._functor,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      (pLVar9->super_Term)._args[0]._content = (uint64_t)puVar14;
    }
    local_78 = pLVar9;
    if (local_f0 == local_e8) goto LAB_004eb52b;
  }
  local_f0 = (Formula *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  this_01 = local_d0;
  local_e8 = (Formula *)::Lib::FixedSizeAllocator<48UL>::alloc(local_d0);
  local_80 = (FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78);
  pFVar5 = (Formula *)
           ::Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  puVar10 = (undefined4 *)::Lib::FixedSizeAllocator<48UL>::alloc(this_01);
  puVar12 = (undefined8 *)
            ::Lib::FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  *puVar12 = local_38;
  puVar12[1] = 0;
  puVar14 = (undefined8 *)
            ::Lib::FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  *puVar14 = pFVar8;
  puVar14[1] = puVar12;
  *puVar10 = 1;
  *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar10 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(undefined8 **)(puVar10 + 10) = puVar14;
  pFVar5->_connective = IMP;
  (pFVar5->_label)._M_dataplus._M_p = (pointer)&(pFVar5->_label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pFVar5->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  context_00 = local_60;
  *(undefined4 **)(pFVar5 + 1) = puVar10;
  pFVar5[1]._label._M_dataplus._M_p = (pointer)local_68;
  pFVar5 = Kernel::Formula::quantify(pFVar5);
  puVar12 = (undefined8 *)
            ::Lib::FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  *puVar12 = pFVar5;
  puVar12[1] = 0;
  puVar14 = (undefined8 *)
            ::Lib::FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  *puVar14 = local_50;
  puVar14[1] = puVar12;
  local_e8->_connective = AND;
  (local_e8->_label)._M_dataplus._M_p = (pointer)&(local_e8->_label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(undefined8 **)(local_e8 + 1) = puVar14;
  pFVar5 = (Formula *)::Lib::FixedSizeAllocator<64UL>::alloc(local_80);
  pFVar5->_connective = IMP;
  (pFVar5->_label)._M_dataplus._M_p = (pointer)&(pFVar5->_label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pFVar5->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(Literal **)(pFVar5 + 1) = local_78;
  pFVar5[1]._label._M_dataplus._M_p = (pointer)local_58;
  pFVar5 = Kernel::Formula::quantify(pFVar5);
  local_f0->_connective = IMP;
  (local_f0->_label)._M_dataplus._M_p = (pointer)&(local_f0->_label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(Formula **)(local_f0 + 1) = local_e8;
  local_f0[1]._label._M_dataplus._M_p = (pointer)pFVar5;
  if (((undefined1  [36])bound1._inner & (undefined1  [36])0x1) == (undefined1  [36])0x0) {
    if ((InferenceRule)local_e0 == INPUT) {
      rule = (char)local_d4 * '\x02' | INT_INF_DOWN_INDUCTION_AXIOM;
    }
    else {
      rule = (char)local_d4 * '\x02' | INT_INF_UP_INDUCTION_AXIOM;
    }
  }
  else {
    rule = (InferenceRule)local_e0 ^ INT_DB_DOWN_INDUCTION_AXIOM;
  }
  produceClauses(&local_c8,local_40,local_f0,rule,context_00,
                 (DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0);
  Indexing::InductionFormulaIndex::Entry::add(local_48,&local_c8,(Substitution *)&local_a8);
  if (local_c8._stack != (Clause **)0x0) {
    uVar15 = local_c8._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar15 == 0) {
      *local_c8._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c8._stack;
    }
    else if (uVar15 < 0x11) {
      *local_c8._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_c8._stack;
    }
    else if (uVar15 < 0x19) {
      *local_c8._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_c8._stack;
    }
    else if (uVar15 < 0x21) {
      *local_c8._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c8._stack;
    }
    else if (uVar15 < 0x31) {
      *local_c8._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c8._stack;
    }
    else if (uVar15 < 0x41) {
      *local_c8._stack = (Clause *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c8._stack;
    }
    else {
      operator_delete(local_c8._stack,0x10);
    }
  }
LAB_004eb52b:
  ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&local_a8);
  return;
}

Assistant:

void InductionClauseIterator::performIntInduction(const InductionContext& context, InductionFormulaIndex::Entry* e, bool increasing, Coproduct<TermLiteralClause, DefaultBound> bound1, const TermLiteralClause* optionalBound2)
{
  TermList b1(bound1.apply([](auto x) { return x.term; }));
  TermList one(theory->representConstant(IntegerConstantType(increasing ? 1 : -1)));

  TermList x(0,false);
  TermList y(1,false);

  // create L[b1]
  Formula* Lb1 = context.getFormula({ b1 },true);

  // create L[X]
  Formula* Lx = context.getFormula({ x },true);

  // create L[Y]
  Substitution subst;
  Formula* Ly = context.getFormula({ y },true,&subst);

  // create L[X+1] or L[X-1]
  TermList fpo(Term::create2(env.signature->getInterpretingSymbol(Theory::INT_PLUS),x,one));
  Formula* Lxpo = context.getFormula({ fpo },true);

  static unsigned less = env.signature->getInterpretingSymbol(Theory::INT_LESS);
  // create X>=b1 (which is ~X<b1) or X<=b1 (which is ~b1<X)
  Formula* Lxcompb1 = new AtomicFormula(Literal::create2(less,false,(increasing ? x : b1),(increasing ? b1 : x)));
  // create Y>=b1 (which is ~Y<b1), or Y>b1, or Y<=b1 (which is ~b1<Y), or Y<b1
  // This comparison is mirroring the structure of bound1.literal, which is "b1 <comparison> inductionTerm".
  // If bound1.literal is nullptr, we are using the default bound with the comparison sign >= or <=.
  const bool isBound1Equal = bound1.match(
      [](TermLiteralClause const& bound1) { return (bound1.literal->functor() == less && bound1.literal->isNegative()); },
      [](DefaultBound) { return true; });
  const bool isBound1FirstArg = (increasing != isBound1Equal);
  Formula* Lycompb1 = new AtomicFormula(Literal::create2(
        less, !isBound1Equal, (isBound1FirstArg ? b1 : y), (isBound1FirstArg ? y : b1)));

  Formula* FxInterval;
  Formula* FyInterval;
  const bool isDefaultBound = bound1.template is<DefaultBound>();
  const bool hasBound2 = ((optionalBound2 != nullptr) && (optionalBound2->literal != nullptr));
  // Also resolve the hypothesis with comparisons with bound(s) (if the bound(s) are present/not default).
  if (hasBound2) {
    // Finite interval induction, use two bounds on both x and y.
    TermList b2(optionalBound2->term);
    if (b1 == b2) {
      return;
    }
    // create X<b2 or X>b2 (which is b2<X)
    Formula* Lxcompb2 = new AtomicFormula(Literal::create2(less, true, (increasing ? x : b2), (increasing ? b2 : x)));
    const bool isBound2Equal = (optionalBound2->literal->functor() == less && optionalBound2->literal->isNegative());
    const bool isBound2FirstArg = (increasing == isBound2Equal);
    // create Y<b2, or Y<=b2 (which is ~b2<Y) or Y>b2, or Y>=b2 (which is ~Y<b2)
    Formula* Lycompb2 = new AtomicFormula(Literal::create2(
          less, !isBound2Equal, (isBound2FirstArg ? b2 : y), (isBound2FirstArg ? y : b2)));
    FxInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lxcompb1, FormulaList::singleton(Lxcompb2)));
    FyInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lycompb1, FormulaList::singleton(Lycompb2)));
  } else {
    // Infinite interval induction (either with default bound or not), use only one bound on both x and y.
    FxInterval = Lxcompb1;
    FyInterval = Lycompb1;
  }

  // Create the hypothesis, with FxInterval and FyInterval being as described
  // in the comment above this function.
  Formula* hyp = new BinaryFormula(Connective::IMP,
                   new JunctionFormula(Connective::AND,FormulaList::cons(Lb1,FormulaList::singleton(
                     Formula::quantify(new BinaryFormula(Connective::IMP,
                       new JunctionFormula(Connective::AND, FormulaList::cons(FxInterval,FormulaList::singleton(Lx))),
                       Lxpo))))),
                   Formula::quantify(new BinaryFormula(Connective::IMP,FyInterval,Ly)));

  InferenceRule rule =
      isDefaultBound
          ? (increasing ? InferenceRule::INT_DB_UP_INDUCTION_AXIOM : InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM)
          : (increasing ? (hasBound2 ? InferenceRule::INT_FIN_UP_INDUCTION_AXIOM : InferenceRule::INT_INF_UP_INDUCTION_AXIOM)
                        : (hasBound2 ? InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM : InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM));

  auto cls = produceClauses(hyp, rule, context);
  e->add(std::move(cls), std::move(subst));
}